

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sceneRender.cpp
# Opt level: O1

void __thiscall SceneRender::SceneRender(SceneRender *this)

{
  vec3 local_3c;
  
  this->_vptr_SceneRender = (_func_int **)&PTR__SceneRender_003eb698;
  this->showGrid = false;
  this->showAxis = false;
  this->showBBoxes = false;
  this->showCubebox = false;
  vera::Fbo::Fbo(&this->renderFbo);
  vera::Fbo::Fbo(&this->normalFbo);
  vera::Fbo::Fbo(&this->positionFbo);
  *(undefined8 *)
   ((long)&(this->buffersFbo).super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>._M_impl.
           super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->buffersFbo).super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 1) = 0;
  (this->buffersFbo).super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->buffersFbo).super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  vera::Node::Node(&this->m_origin);
  this->m_blend = BLEND_ALPHA;
  this->m_culling = CULL_NONE;
  this->m_depth_test = true;
  (this->m_lightUI_vbo)._M_t.super___uniq_ptr_impl<vera::Vbo,_std::default_delete<vera::Vbo>_>._M_t.
  super__Tuple_impl<0UL,_vera::Vbo_*,_std::default_delete<vera::Vbo>_>.
  super__Head_base<0UL,_vera::Vbo_*,_false>._M_head_impl = (Vbo *)0x0;
  vera::Shader::Shader(&this->m_lightUI_shader);
  this->m_shadows = false;
  vera::Shader::Shader(&this->m_background_shader);
  this->m_background = false;
  vera::Shader::Shader(&this->m_cubemap_shader);
  (this->m_cubemap_vbo)._M_t.super___uniq_ptr_impl<vera::Vbo,_std::default_delete<vera::Vbo>_>._M_t.
  super__Tuple_impl<0UL,_vera::Vbo_*,_std::default_delete<vera::Vbo>_>.
  super__Head_base<0UL,_vera::Vbo_*,_false>._M_head_impl = (Vbo *)0x0;
  vera::Model::Model(&this->m_floor);
  this->m_floor_height = 0.0;
  this->m_floor_subd_target = -1;
  this->m_floor_subd = -1;
  this->m_buffers_total = 0;
  this->m_commands_loaded = false;
  this->m_uniforms_loaded = false;
  (this->m_devlook_spheres).super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_devlook_spheres).super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_devlook_spheres).super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_devlook_billboards).super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_devlook_billboards).super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_devlook_billboards).super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_grid_vbo)._M_t.super___uniq_ptr_impl<vera::Vbo,_std::default_delete<vera::Vbo>_>._M_t.
  super__Tuple_impl<0UL,_vera::Vbo_*,_std::default_delete<vera::Vbo>_>.
  super__Head_base<0UL,_vera::Vbo_*,_false>._M_head_impl = (Vbo *)0x0;
  (this->m_axis_vbo)._M_t.super___uniq_ptr_impl<vera::Vbo,_std::default_delete<vera::Vbo>_>._M_t.
  super__Tuple_impl<0UL,_vera::Vbo_*,_std::default_delete<vera::Vbo>_>.
  super__Head_base<0UL,_vera::Vbo_*,_false>._M_head_impl = (Vbo *)0x0;
  local_3c.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x0;
  local_3c.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
  local_3c.field_2.z = 0.0;
  vera::Node::setPosition(&this->m_origin,&local_3c);
  return;
}

Assistant:

SceneRender::SceneRender(): 
    // Debug State
    showGrid(false), showAxis(false), showBBoxes(false), showCubebox(false), 
    // Camera.
    m_blend(vera::BLEND_ALPHA), m_culling(vera::CULL_NONE), m_depth_test(true),
    // Light
    dynamicShadows(false), m_shadows(false),
    // Background
    m_background(false), 
    // Floor
    m_floor_height(0.0), m_floor_subd_target(-1), m_floor_subd(-1),

    m_buffers_total(0), m_commands_loaded(false), m_uniforms_loaded(false)
    {
    m_origin.setPosition(glm::vec3(0.0));
}